

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O0

int Ivy_ManCheckFanouts(Ivy_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *vArray;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  bool bVar5;
  int local_44;
  int local_40;
  int RetValue;
  int k;
  int i;
  Ivy_Obj_t *pFanin;
  Ivy_Obj_t *pFanout;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *vFanouts;
  Ivy_Man_t *p_local;
  
  local_44 = 1;
  if (p->fFanout == 0) {
    p_local._4_4_ = 1;
  }
  else {
    vArray = Vec_PtrAlloc(100);
    for (RetValue = 0; iVar1 = Vec_PtrSize(p->vObjs), RetValue < iVar1; RetValue = RetValue + 1) {
      pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,RetValue);
      if ((pIVar2 != (Ivy_Obj_t *)0x0) &&
         (pIVar4 = Ivy_ObjFanin0(pIVar2), pIVar4 != (Ivy_Obj_t *)0x0)) {
        local_40 = 0;
        Ivy_ObjCollectFanouts(p,pIVar4,vArray);
        while( true ) {
          iVar1 = Vec_PtrSize(vArray);
          bVar5 = false;
          if (local_40 < iVar1) {
            pFanin = (Ivy_Obj_t *)Vec_PtrEntry(vArray,local_40);
            bVar5 = pFanin != (Ivy_Obj_t *)0x0;
          }
          if ((!bVar5) || (pFanin == pIVar2)) break;
          local_40 = local_40 + 1;
        }
        iVar1 = Vec_PtrSize(vArray);
        if (local_40 == iVar1) {
          printf("Node %d is a fanin of node %d but the fanout is not there.\n",
                 (ulong)(uint)pIVar4->Id,(ulong)(uint)pIVar2->Id);
          local_44 = 0;
        }
        pIVar4 = Ivy_ObjFanin1(pIVar2);
        if (pIVar4 != (Ivy_Obj_t *)0x0) {
          local_40 = 0;
          Ivy_ObjCollectFanouts(p,pIVar4,vArray);
          while( true ) {
            iVar1 = Vec_PtrSize(vArray);
            bVar5 = false;
            if (local_40 < iVar1) {
              pFanin = (Ivy_Obj_t *)Vec_PtrEntry(vArray,local_40);
              bVar5 = pFanin != (Ivy_Obj_t *)0x0;
            }
            if ((!bVar5) || (pFanin == pIVar2)) break;
            local_40 = local_40 + 1;
          }
          iVar1 = Vec_PtrSize(vArray);
          if (local_40 == iVar1) {
            printf("Node %d is a fanin of node %d but the fanout is not there.\n",
                   (ulong)(uint)pIVar4->Id,(ulong)(uint)pIVar2->Id);
            local_44 = 0;
          }
          if (pIVar2->pPrevFan0 != (Ivy_Obj_t *)0x0) {
            pIVar4 = Ivy_ObjFanin0(pIVar2->pPrevFan0);
            pIVar3 = Ivy_ObjFanin0(pIVar2);
            if (pIVar4 != pIVar3) {
              pIVar4 = Ivy_ObjFanin0(pIVar2->pPrevFan0);
              pIVar3 = Ivy_ObjFanin1(pIVar2);
              if (pIVar4 != pIVar3) {
                pIVar4 = Ivy_ObjFanin1(pIVar2->pPrevFan0);
                pIVar3 = Ivy_ObjFanin0(pIVar2);
                if (pIVar4 != pIVar3) {
                  pIVar4 = Ivy_ObjFanin1(pIVar2->pPrevFan0);
                  pIVar3 = Ivy_ObjFanin1(pIVar2);
                  if (pIVar4 != pIVar3) {
                    printf("Node %d has prev %d without common fanin.\n",(ulong)(uint)pIVar2->Id,
                           (ulong)(uint)pIVar2->pPrevFan0->Id);
                    local_44 = 0;
                  }
                }
              }
            }
          }
          if (pIVar2->pPrevFan1 != (Ivy_Obj_t *)0x0) {
            pIVar4 = Ivy_ObjFanin0(pIVar2->pPrevFan1);
            pIVar3 = Ivy_ObjFanin0(pIVar2);
            if (pIVar4 != pIVar3) {
              pIVar4 = Ivy_ObjFanin0(pIVar2->pPrevFan1);
              pIVar3 = Ivy_ObjFanin1(pIVar2);
              if (pIVar4 != pIVar3) {
                pIVar4 = Ivy_ObjFanin1(pIVar2->pPrevFan1);
                pIVar3 = Ivy_ObjFanin0(pIVar2);
                if (pIVar4 != pIVar3) {
                  pIVar4 = Ivy_ObjFanin1(pIVar2->pPrevFan1);
                  pIVar3 = Ivy_ObjFanin1(pIVar2);
                  if (pIVar4 != pIVar3) {
                    printf("Node %d has prev %d without common fanin.\n",(ulong)(uint)pIVar2->Id,
                           (ulong)(uint)pIVar2->pPrevFan1->Id);
                    local_44 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    for (RetValue = 0; iVar1 = Vec_PtrSize(p->vObjs), RetValue < iVar1; RetValue = RetValue + 1) {
      pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,RetValue);
      if (pIVar2 != (Ivy_Obj_t *)0x0) {
        local_40 = 0;
        Ivy_ObjCollectFanouts(p,pIVar2,vArray);
        while( true ) {
          iVar1 = Vec_PtrSize(vArray);
          bVar5 = false;
          if (local_40 < iVar1) {
            pFanin = (Ivy_Obj_t *)Vec_PtrEntry(vArray,local_40);
            bVar5 = pFanin != (Ivy_Obj_t *)0x0;
          }
          if (!bVar5) break;
          pIVar4 = Ivy_ObjFanin0(pFanin);
          if ((pIVar4 != pIVar2) && (pIVar4 = Ivy_ObjFanin1(pFanin), pIVar4 != pIVar2)) {
            printf("Node %d is a fanout of node %d but the fanin is not there.\n",
                   (ulong)(uint)pFanin->Id,(ulong)(uint)pIVar2->Id);
            local_44 = 0;
          }
          local_40 = local_40 + 1;
        }
      }
    }
    Vec_PtrFree(vArray);
    p_local._4_4_ = local_44;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ManCheckFanouts( Ivy_Man_t * p )
{
    Vec_Ptr_t * vFanouts;
    Ivy_Obj_t * pObj, * pFanout, * pFanin;
    int i, k, RetValue = 1;
    if ( !p->fFanout )
        return 1;
    vFanouts = Vec_PtrAlloc( 100 );
    // make sure every fanin is a fanout
    Ivy_ManForEachObj( p, pObj, i )
    {
        pFanin = Ivy_ObjFanin0(pObj);
        if ( pFanin == NULL )
            continue;
        Ivy_ObjForEachFanout( p, pFanin, vFanouts, pFanout, k )
            if ( pFanout == pObj )
                break;
        if ( k == Vec_PtrSize(vFanouts) )
        {
            printf( "Node %d is a fanin of node %d but the fanout is not there.\n", pFanin->Id, pObj->Id );
            RetValue = 0;
        }

        pFanin = Ivy_ObjFanin1(pObj);
        if ( pFanin == NULL )
            continue;
        Ivy_ObjForEachFanout( p, pFanin, vFanouts, pFanout, k )
            if ( pFanout == pObj )
                break;
        if ( k == Vec_PtrSize(vFanouts) )
        {
            printf( "Node %d is a fanin of node %d but the fanout is not there.\n", pFanin->Id, pObj->Id );
            RetValue = 0;
        }
        // check that the previous fanout has the same fanin
        if ( pObj->pPrevFan0 )
        {
            if ( Ivy_ObjFanin0(pObj->pPrevFan0) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin0(pObj->pPrevFan0) != Ivy_ObjFanin1(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan0) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan0) != Ivy_ObjFanin1(pObj) )
            {
                printf( "Node %d has prev %d without common fanin.\n", pObj->Id, pObj->pPrevFan0->Id );
                RetValue = 0;
            }
        }
        // check that the previous fanout has the same fanin
        if ( pObj->pPrevFan1 )
        {
            if ( Ivy_ObjFanin0(pObj->pPrevFan1) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin0(pObj->pPrevFan1) != Ivy_ObjFanin1(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan1) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan1) != Ivy_ObjFanin1(pObj) )
            {
                printf( "Node %d has prev %d without common fanin.\n", pObj->Id, pObj->pPrevFan1->Id );
                RetValue = 0;
            }
        }
    }
    // make sure every fanout is a fanin
    Ivy_ManForEachObj( p, pObj, i )
    {
        Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, k )
            if ( Ivy_ObjFanin0(pFanout) != pObj && Ivy_ObjFanin1(pFanout) != pObj )
            {
                printf( "Node %d is a fanout of node %d but the fanin is not there.\n", pFanout->Id, pObj->Id );
                RetValue = 0;
            }
    }
    Vec_PtrFree( vFanouts );
    return RetValue;
}